

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

String * __thiscall efsw::String::replace(String *this,Iterator i1,Iterator i2,char *s)

{
  String tmp;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_40;
  
  String((String *)&local_40,s);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  replace(&this->mString,(__const_iterator)i1._M_current,(__const_iterator)i2._M_current,&local_40);
  std::__cxx11::u32string::~u32string((u32string *)&local_40);
  return this;
}

Assistant:

String& String::replace( Iterator i1, Iterator i2, const char* s ) {
	String tmp( s );

	mString.replace( i1, i2, tmp.mString );

	return *this;
}